

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalCommonGenerator::GetTargetFortranFlags
          (string *__return_storage_ptr__,cmLocalCommonGenerator *this,cmGeneratorTarget *target,
          string *config)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  char *pcVar3;
  string *psVar4;
  pointer source;
  string modflag;
  string mod_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_b8;
  string local_98;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  char *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CMAKE_Fortran_MODOUT_FLAG",(allocator<char> *)&local_b8);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (pcVar3 != (char *)0x0) {
    (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[7])(this,__return_storage_ptr__,pcVar3);
  }
  cmGeneratorTarget::GetFortranModuleDirectory(&local_78,target,&this->WorkingDirectory);
  if (local_78._M_string_length == 0) {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"CMAKE_Fortran_MODDIR_DEFAULT",(allocator<char> *)&local_98);
    cmMakefile::GetSafeDefinition(pcVar1,&local_b8);
    std::__cxx11::string::_M_assign((string *)&local_78);
    psVar4 = &local_b8;
  }
  else {
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_98,&this->super_cmLocalGenerator,&this->WorkingDirectory,&local_78);
    cmOutputConverter::ConvertToOutputFormat
              (&local_b8,&(this->super_cmLocalGenerator).super_cmOutputConverter,&local_98,SHELL);
    std::__cxx11::string::operator=((string *)&local_78,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    psVar4 = &local_98;
  }
  std::__cxx11::string::~string((string *)psVar4);
  if (local_78._M_string_length != 0) {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"CMAKE_Fortran_MODDIR_FLAG",(allocator<char> *)&local_58);
    psVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_98);
    std::__cxx11::string::string((string *)&local_b8,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::append((string *)&local_b8);
    (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
              (this,__return_storage_ptr__,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"CMAKE_Fortran_MODPATH_FLAG",(allocator<char> *)&local_98);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  if (pcVar3 != (char *)0x0) {
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"C",(allocator<char> *)&local_98);
    local_38 = pcVar3;
    cmLocalGenerator::GetIncludeDirectories
              (&this->super_cmLocalGenerator,&local_58,target,&local_b8,config);
    std::__cxx11::string::~string((string *)&local_b8);
    pbVar2 = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (source = local_58.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; source != pbVar2; source = source + 1)
    {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,local_38,(allocator<char> *)&local_98);
      cmOutputConverter::ConvertToOutputFormat
                (&local_98,&(this->super_cmLocalGenerator).super_cmOutputConverter,source,SHELL);
      std::__cxx11::string::append((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_98);
      (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
                (this,__return_storage_ptr__,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
  }
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalCommonGenerator::GetTargetFortranFlags(
  cmGeneratorTarget const* target, std::string const& config)
{
  std::string flags;

  // Enable module output if necessary.
  if (const char* modout_flag =
        this->Makefile->GetDefinition("CMAKE_Fortran_MODOUT_FLAG")) {
    this->AppendFlags(flags, modout_flag);
  }

  // Add a module output directory flag if necessary.
  std::string mod_dir =
    target->GetFortranModuleDirectory(this->WorkingDirectory);
  if (!mod_dir.empty()) {
    mod_dir = this->ConvertToOutputFormat(
      this->MaybeConvertToRelativePath(this->WorkingDirectory, mod_dir),
      cmOutputConverter::SHELL);
  } else {
    mod_dir =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_DEFAULT");
  }
  if (!mod_dir.empty()) {
    std::string modflag =
      this->Makefile->GetRequiredDefinition("CMAKE_Fortran_MODDIR_FLAG");
    modflag += mod_dir;
    this->AppendFlags(flags, modflag);
  }

  // If there is a separate module path flag then duplicate the
  // include path with it.  This compiler does not search the include
  // path for modules.
  if (const char* modpath_flag =
        this->Makefile->GetDefinition("CMAKE_Fortran_MODPATH_FLAG")) {
    std::vector<std::string> includes;
    this->GetIncludeDirectories(includes, target, "C", config);
    for (std::string const& id : includes) {
      std::string flg = modpath_flag;
      flg += this->ConvertToOutputFormat(id, cmOutputConverter::SHELL);
      this->AppendFlags(flags, flg);
    }
  }

  return flags;
}